

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

void Gia_ManAreCompress(Gia_ManAre_t *p,Gia_PtrAre_t *pRoot)

{
  uint *puVar1;
  Gia_PtrAre_t GVar2;
  Gia_PtrAre_t GVar3;
  uint **ppuVar4;
  int iVar5;
  Gia_PtrAre_t GVar6;
  int iVar7;
  long *plVar8;
  
  GVar6 = *pRoot;
  if (((uint)GVar6 & 0x7fffffff) != 0) {
    GVar3 = (Gia_PtrAre_t)((uint)GVar6 & 0x80000000);
    *pRoot = GVar3;
    ppuVar4 = p->ppStas;
    plVar8 = (long *)((ulong)((uint)GVar6 >> 0x11 & 0x3ff8) + (long)ppuVar4);
    iVar5 = p->nSize;
    iVar7 = ((uint)GVar6 & 0xfffff) * iVar5;
    while( true ) {
      puVar1 = (uint *)(*plVar8 + (long)iVar7 * 4);
      if (*ppuVar4 == puVar1) break;
      GVar2 = *(Gia_PtrAre_t *)(*plVar8 + 4 + (long)iVar7 * 4);
      if (-1 < (int)*puVar1) {
        *(Gia_PtrAre_t *)(puVar1 + 1) = GVar3;
        *pRoot = GVar6;
        ppuVar4 = p->ppStas;
        iVar5 = p->nSize;
        GVar3 = GVar6;
      }
      plVar8 = (long *)((ulong)((uint)GVar2 >> 0x11 & 0x3ff8) + (long)ppuVar4);
      iVar7 = ((uint)GVar2 & 0xfffff) * iVar5;
      GVar6 = GVar2;
    }
    return;
  }
  __assert_fail("pRoot->nItem || pRoot->nPage",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEra2.c"
                ,0x3b1,"void Gia_ManAreCompress(Gia_ManAre_t *, Gia_PtrAre_t *)");
}

Assistant:

static inline void Gia_ManAreCompress( Gia_ManAre_t * p, Gia_PtrAre_t * pRoot )
{
    Gia_StaAre_t * pCube;
    Gia_PtrAre_t iList = *pRoot;
    Gia_PtrAre_t iCube, iNext;
    assert( pRoot->nItem || pRoot->nPage );
    pRoot->nItem = 0; 
    pRoot->nPage = 0;
    for ( iCube = iList, pCube = Gia_ManAreSta(p, iCube), iNext = pCube->iNext; 
          Gia_StaIsGood(p, pCube); 
          iCube = iNext, pCube = Gia_ManAreSta(p, iCube), iNext = pCube->iNext )
    {
        if ( Gia_StaIsUnused(pCube) )
            continue;
        pCube->iNext = *pRoot;
        *pRoot = iCube;
    }
}